

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O1

CURLcode Curl_input_ntlm(Curl_easy *data,_Bool proxy,char *header)

{
  ntlmdata *ntlm;
  ntlmdata *ntlm_00;
  uchar *puVar1;
  long lVar2;
  char cVar3;
  connectdata *pcVar4;
  curl_trc_feat *pcVar5;
  int iVar6;
  CURLcode CVar7;
  undefined7 in_register_00000031;
  ntlmdata *ntlm_01;
  char *src;
  size_t hdrlen;
  uchar *hdr;
  bufref hdrbuf;
  size_t local_58;
  uchar *local_50;
  bufref local_48;
  
  pcVar4 = data->conn;
  ntlm = &pcVar4->ntlm;
  ntlm_00 = &pcVar4->proxyntlm;
  ntlm_01 = ntlm;
  if ((int)CONCAT71(in_register_00000031,proxy) != 0) {
    ntlm_01 = ntlm_00;
  }
  iVar6 = curl_strnequal(header,"NTLM",4);
  if (iVar6 == 0) {
    return CURLE_OK;
  }
  lVar2 = (CONCAT71(in_register_00000031,proxy) & 0xffffffff) * 4;
  src = header + 4;
  do {
    cVar3 = *src;
    if ((cVar3 != '\t') && (cVar3 != ' ')) {
      if (cVar3 == '\0') goto LAB_0013bacd;
      if (3 < (byte)(cVar3 - 10U)) {
        if (cVar3 != '\0') {
          CVar7 = Curl_base64_decode(src,&local_50,&local_58);
          if (CVar7 == CURLE_OK) {
            Curl_bufref_init(&local_48);
            Curl_bufref_set(&local_48,local_50,local_58,curl_free);
            CVar7 = Curl_auth_decode_ntlm_type2_message(data,&local_48,ntlm_01);
            Curl_bufref_free(&local_48);
          }
          if (CVar7 != CURLE_OK) {
            return CVar7;
          }
          puVar1 = (pcVar4->ntlm).nonce + lVar2 + -0xc;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          return CURLE_OK;
        }
LAB_0013bacd:
        iVar6 = *(int *)((pcVar4->ntlm).nonce + lVar2 + -0xc);
        if (iVar6 != 0) {
          if (iVar6 == 3) {
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                (0 < pcVar5->log_level)))) {
              Curl_infof(data,"NTLM handshake rejected");
            }
            Curl_auth_cleanup_ntlm(ntlm);
            Curl_auth_cleanup_ntlm(ntlm_00);
            puVar1 = (pcVar4->ntlm).nonce + lVar2 + -0xc;
            puVar1[0] = '\0';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            return CURLE_REMOTE_ACCESS_DENIED;
          }
          if (iVar6 != 4) {
            if (data == (Curl_easy *)0x0) {
              return CURLE_REMOTE_ACCESS_DENIED;
            }
            if (((data->set).field_0x8cd & 0x10) == 0) {
              return CURLE_REMOTE_ACCESS_DENIED;
            }
            pcVar5 = (data->state).feat;
            if ((pcVar5 != (curl_trc_feat *)0x0) && (pcVar5->log_level < 1)) {
              return CURLE_REMOTE_ACCESS_DENIED;
            }
            Curl_infof(data,"NTLM handshake failure (internal error)");
            return CURLE_REMOTE_ACCESS_DENIED;
          }
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
              (0 < pcVar5->log_level)))) {
            Curl_infof(data,"NTLM auth restarted");
          }
          Curl_auth_cleanup_ntlm(ntlm);
          Curl_auth_cleanup_ntlm(ntlm_00);
        }
        puVar1 = (pcVar4->ntlm).nonce + lVar2 + -0xc;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        return CURLE_OK;
      }
    }
    src = src + 1;
  } while( true );
}

Assistant:

CURLcode Curl_input_ntlm(struct Curl_easy *data,
                         bool proxy,         /* if proxy or not */
                         const char *header) /* rest of the www-authenticate:
                                                header */
{
  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  curlntlm *state;
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  ntlm = proxy ? &conn->proxyntlm : &conn->ntlm;
  state = proxy ? &conn->proxy_ntlm_state : &conn->http_ntlm_state;

  if(checkprefix("NTLM", header)) {
    header += strlen("NTLM");

    while(*header && ISSPACE(*header))
      header++;

    if(*header) {
      unsigned char *hdr;
      size_t hdrlen;

      result = Curl_base64_decode(header, &hdr, &hdrlen);
      if(!result) {
        struct bufref hdrbuf;

        Curl_bufref_init(&hdrbuf);
        Curl_bufref_set(&hdrbuf, hdr, hdrlen, curl_free);
        result = Curl_auth_decode_ntlm_type2_message(data, &hdrbuf, ntlm);
        Curl_bufref_free(&hdrbuf);
      }
      if(result)
        return result;

      *state = NTLMSTATE_TYPE2; /* We got a type-2 message */
    }
    else {
      if(*state == NTLMSTATE_LAST) {
        infof(data, "NTLM auth restarted");
        Curl_http_auth_cleanup_ntlm(conn);
      }
      else if(*state == NTLMSTATE_TYPE3) {
        infof(data, "NTLM handshake rejected");
        Curl_http_auth_cleanup_ntlm(conn);
        *state = NTLMSTATE_NONE;
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      else if(*state >= NTLMSTATE_TYPE1) {
        infof(data, "NTLM handshake failure (internal error)");
        return CURLE_REMOTE_ACCESS_DENIED;
      }

      *state = NTLMSTATE_TYPE1; /* We should send away a type-1 */
    }
  }

  return result;
}